

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

void __thiscall
slang::ast::DeclaredType::mergePortTypes
          (DeclaredType *this,ASTContext *context,ValueSymbol *sourceSymbol,
          ImplicitTypeSyntax *implicit,SourceLocation location,
          span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
          unpackedDimensions)

{
  bool bVar1;
  bool bVar2;
  Type *pTVar3;
  NetSymbol *pNVar4;
  Diagnostic *pDVar5;
  Diagnostic *pDVar6;
  Compilation *pCVar7;
  Compilation *this_00;
  SourceLocation SVar8;
  SourceRange sourceRange;
  string_view arg;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  char *local_168;
  anon_class_24_3_ad3c716d checkDims;
  anon_class_16_2_44ff5dbb errorDims;
  pointer local_138;
  undefined1 auStack_128 [7];
  bool shouldBeSigned;
  anon_class_32_4_c3673f5c warnSignedness;
  Diagnostic *diag_1;
  Diagnostic *diag;
  Compilation *local_78;
  Type *sourceType;
  SmallVector<slang::ConstantRange,_4UL> destDims;
  Type *destType;
  ImplicitTypeSyntax *implicit_local;
  ValueSymbol *sourceSymbol_local;
  ASTContext *context_local;
  DeclaredType *this_local;
  SourceLocation location_local;
  
  SVar8 = location;
  destDims.stackBase._16_8_ = ValueSymbol::getType(sourceSymbol);
  bVar1 = parsing::Token::operator_cast_to_bool(&implicit->signing);
  if (bVar1) {
    SmallVector<slang::ConstantRange,_4UL>::SmallVector
              ((SmallVector<slang::ConstantRange,_4UL> *)&sourceType);
    local_78 = (Compilation *)destDims.stackBase._16_8_;
    while (pTVar3 = Type::getCanonicalType((Type *)local_78),
          (pTVar3->super_Symbol).kind == FixedSizeUnpackedArrayType) {
      register0x00000000 = Type::getFixedRange((Type *)local_78);
      SmallVectorBase<slang::ConstantRange>::push_back
                ((SmallVectorBase<slang::ConstantRange> *)&sourceType,
                 (ConstantRange *)((long)&diag + 4));
      local_78 = (Compilation *)Type::getArrayElementType((Type *)local_78);
    }
    bVar1 = Type::isError((Type *)local_78);
    if (bVar1) {
      diag._0_4_ = 1;
    }
    else {
      bVar1 = Type::isIntegral((Type *)local_78);
      if (bVar1) {
        warnSignedness.implicit = (ImplicitTypeSyntax *)(destDims.stackBase + 0x10);
        bVar1 = (implicit->signing).kind != SignedKeyword;
        _auStack_128 = context;
        warnSignedness.context = (ASTContext *)implicit;
        warnSignedness.destType = (Type **)sourceSymbol;
        if ((bVar1) || (bVar2 = Type::isSigned((Type *)local_78), bVar2)) {
          if ((bVar1) && (bVar1 = Type::isSigned((Type *)local_78), bVar1)) {
            mergePortTypes::anon_class_32_4_c3673f5c::operator()
                      ((anon_class_32_4_c3673f5c *)auStack_128);
          }
        }
        else {
          pCVar7 = ASTContext::getCompilation(context);
          local_78 = (Compilation *)makeSigned(pCVar7,(Type *)local_78);
          bVar1 = Type::isSigned((Type *)local_78);
          if (bVar1) {
            this_00 = ASTContext::getCompilation(context);
            pCVar7 = local_78;
            nonstd::span_lite::span<const_slang::ConstantRange,_18446744073709551615UL>::
            span<slang::SmallVector<slang::ConstantRange,_4UL>,_0>
                      ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                       &errorDims.sourceSymbol,(SmallVector<slang::ConstantRange,_4UL> *)&sourceType
                      );
            dimensions.size_ = (size_type)SVar8;
            dimensions.data_ = local_138;
            destDims.stackBase._16_8_ =
                 FixedSizeUnpackedArrayType::fromDims
                           ((FixedSizeUnpackedArrayType *)this_00,pCVar7,
                            (Type *)errorDims.sourceSymbol,dimensions);
          }
          else {
            mergePortTypes::anon_class_32_4_c3673f5c::operator()
                      ((anon_class_32_4_c3673f5c *)auStack_128);
          }
        }
        diag._0_4_ = 0;
      }
      else {
        if (((sourceSymbol->super_Symbol).kind == Net) &&
           (pNVar4 = Symbol::as<slang::ast::NetSymbol>(&sourceSymbol->super_Symbol),
           pNVar4->netType->netKind == Interconnect)) {
          sourceRange = parsing::Token::range(&implicit->signing);
          pDVar5 = ASTContext::addDiag(context,(DiagCode)0x510005,sourceRange);
          Diagnostic::addNote(pDVar5,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
        }
        else {
          pDVar5 = ASTContext::addDiag(context,(DiagCode)0xc0006,location);
          pDVar6 = Diagnostic::operator<<(pDVar5,(sourceSymbol->super_Symbol).name);
          arg = parsing::Token::valueText(&implicit->signing);
          pDVar6 = Diagnostic::operator<<(pDVar6,arg);
          ast::operator<<(pDVar6,(Type *)destDims.stackBase._16_8_);
          warnSignedness.sourceSymbol = *(ValueSymbol **)&(sourceSymbol->super_Symbol).location;
          Diagnostic::addNote(pDVar5,(DiagCode)0x40001,(SourceLocation)warnSignedness.sourceSymbol);
        }
        diag._0_4_ = 1;
      }
    }
    SmallVector<slang::ConstantRange,_4UL>::~SmallVector
              ((SmallVector<slang::ConstantRange,_4UL> *)&sourceType);
    if ((int)diag != 0) {
      return;
    }
  }
  this->type = (Type *)destDims.stackBase._16_8_;
  local_168 = destDims.stackBase + 0x10;
  checkDims.destType = (Type **)&checkDims.context;
  checkDims.errorDims = (anon_class_16_2_44ff5dbb *)context;
  checkDims.context = context;
  errorDims.context = (ASTContext *)sourceSymbol;
  const::$_1::operator()((__1 *)&local_168,&unpackedDimensions,FixedSizeUnpackedArrayType,false);
  const::$_1::operator()((__1 *)&local_168,&implicit->dimensions,PackedArrayType,true);
  return;
}

Assistant:

void DeclaredType::mergePortTypes(
    const ASTContext& context, const ValueSymbol& sourceSymbol, const ImplicitTypeSyntax& implicit,
    SourceLocation location, span<const VariableDimensionSyntax* const> unpackedDimensions) const {

    // There's this really terrible "feature" where the port declaration can influence the type
    // of the actual symbol somewhere else in the tree. This is ugly but should be safe since
    // nobody else can look at that symbol's type until we've gone through elaboration.
    //
    // In this context, the sourceSymbol is the actual variable declaration with, presumably,
    // a full type declared. The implicit syntax is from the port I/O declaration, which needs
    // to be merged. For example:
    //
    //   input signed [1:0] foo;    // implicit + unpackedDimensions + location
    //   logic foo;                 // sourceSymbol
    const Type* destType = &sourceSymbol.getType();

    if (implicit.signing) {
        // Drill past any unpacked arrays to figure out if this thing is even integral.
        SmallVector<ConstantRange, 4> destDims;
        const Type* sourceType = destType;
        while (sourceType->getCanonicalType().kind == SymbolKind::FixedSizeUnpackedArrayType) {
            destDims.push_back(sourceType->getFixedRange());
            sourceType = sourceType->getArrayElementType();
        }

        if (sourceType->isError())
            return;

        if (!sourceType->isIntegral()) {
            if (sourceSymbol.kind == SymbolKind::Net &&
                sourceSymbol.as<NetSymbol>().netType.netKind == NetType::Interconnect) {
                auto& diag = context.addDiag(diag::InterconnectTypeSyntax,
                                             implicit.signing.range());
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            else {
                auto& diag = context.addDiag(diag::CantDeclarePortSigned, location);
                diag << sourceSymbol.name << implicit.signing.valueText() << *destType;
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            return;
        }

        auto warnSignedness = [&] {
            auto& diag = context.addDiag(diag::SignednessNoEffect, implicit.signing.range());
            diag << implicit.signing.valueText() << *destType;
            diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
        };

        bool shouldBeSigned = implicit.signing.kind == TokenKind::SignedKeyword;
        if (shouldBeSigned && !sourceType->isSigned()) {
            sourceType = makeSigned(context.getCompilation(), *sourceType);
            if (!sourceType->isSigned()) {
                warnSignedness();
            }
            else {
                // Put the unpacked dimensions back on the type now that it
                // has been made signed.
                destType = &FixedSizeUnpackedArrayType::fromDims(context.getCompilation(),
                                                                 *sourceType, destDims);
            }
        }
        else if (!shouldBeSigned && sourceType->isSigned()) {
            warnSignedness();
        }
    }

    // Our declared type takes on the merged type from the variable definition.
    this->type = destType;

    auto errorDims = [&](auto& dims) {
        auto& diag = context.addDiag(diag::PortDeclDimensionsMismatch, dims.sourceRange());
        diag << sourceSymbol.name;
        diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
    };

    auto checkDims = [&](auto& dims, SymbolKind arrayKind, bool isPacked) {
        if (!dims.empty()) {
            auto it = dims.begin();
            while (destType->getCanonicalType().kind == arrayKind) {
                if (it == dims.end()) {
                    errorDims(*dims.back());
                    return;
                }

                auto dim = isPacked ? context.evalPackedDimension(**it)
                                    : context.evalUnpackedDimension(**it);
                if (!dim || destType->getFixedRange() != *dim) {
                    errorDims(**it);
                    return;
                }

                destType = destType->getArrayElementType();
                it++;
            }

            if (it != dims.end() && !destType->isError()) {
                errorDims(**it);
                return;
            }
        }
    };

    // Unpacked dim checks have to come first because it unwraps the destType
    // for the packed one to look at.
    checkDims(unpackedDimensions, SymbolKind::FixedSizeUnpackedArrayType, false);
    checkDims(implicit.dimensions, SymbolKind::PackedArrayType, true);
}